

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O0

void od_ec_enc_normalize(od_ec_enc *enc,od_ec_enc_window low,uint rng)

{
  short sVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong carry_00;
  byte bVar9;
  uint in_EDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  uint64_t carry;
  uint64_t mask;
  uint64_t output;
  uint8_t num_bytes_ready;
  uint32_t offs;
  uint32_t storage;
  uchar *out;
  int s;
  int c;
  int d;
  uint8_t in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar10;
  int local_20;
  ulong local_10;
  
  if (*(int *)((long)in_RDI + 0x1c) == 0) {
    sVar1 = *(short *)((long)in_RDI + 0x1a);
    iVar3 = get_msb(in_EDX);
    iVar3 = 0x10 - (iVar3 + 1);
    local_20 = sVar1 + iVar3;
    local_10 = in_RSI;
    if (0x27 < local_20) {
      uVar4 = *(uint *)(in_RDI + 1);
      iVar10 = *(int *)((long)in_RDI + 0xc);
      if (uVar4 < iVar10 + 8U) {
        uVar4 = uVar4 * 2 + 8;
        pvVar6 = realloc((void *)*in_RDI,(ulong)uVar4);
        if (pvVar6 == (void *)0x0) {
          *(undefined4 *)((long)in_RDI + 0x1c) = 0xffffffff;
          return;
        }
        *in_RDI = pvVar6;
        *(uint *)(in_RDI + 1) = uVar4;
      }
      bVar2 = (char)(local_20 >> 3) + 1;
      iVar5 = (uint)bVar2 * -8 + 0x18 + (int)sVar1;
      bVar9 = (byte)iVar5;
      uVar7 = in_RSI >> (bVar9 & 0x3f);
      local_10 = in_RSI & (1L << (bVar9 & 0x3f)) - 1U;
      uVar8 = 1L << ((bVar2 & 7) << 3);
      carry_00 = uVar8 - 1;
      write_enc_data_to_out_buf
                ((uchar *)CONCAT44(uVar4,iVar10),CONCAT13(bVar2,(int3)in_stack_ffffffffffffffcc),
                 uVar7 & carry_00,carry_00,(uint32_t *)(uVar7 & uVar8),in_stack_ffffffffffffffaf);
      local_20 = iVar5 + iVar3 + -0x18;
    }
    in_RDI[2] = local_10 << ((byte)iVar3 & 0x3f);
    *(short *)(in_RDI + 3) = (short)(in_EDX << ((byte)iVar3 & 0x1f));
    *(short *)((long)in_RDI + 0x1a) = (short)local_20;
  }
  return;
}

Assistant:

static void od_ec_enc_normalize(od_ec_enc *enc, od_ec_enc_window low,
                                unsigned rng) {
  int d;
  int c;
  int s;
  if (enc->error) return;
  c = enc->cnt;
  assert(rng <= 65535U);
  /*The number of leading zeros in the 16-bit binary representation of rng.*/
  d = 16 - OD_ILOG_NZ(rng);
  s = c + d;

  /* We flush every time "low" cannot safely and efficiently accommodate any
     more data. Overall, c must not exceed 63 at the time of byte flush out. To
     facilitate this, "s" cannot exceed 56-bits because we have to keep 1 byte
     for carry. Also, we need to subtract 16 because we want to keep room for
     the next symbol worth "d"-bits (max 15). An alternate condition would be if
     (e < d), where e = number of leading zeros in "low", indicating there is
     not enough rooom to accommodate "rng" worth of "d"-bits in "low". However,
     this approach needs additional computations: (i) compute "e", (ii) push
     the leading 0x00's as a special case.
  */
  if (s >= 40) {  // 56 - 16
    unsigned char *out = enc->buf;
    uint32_t storage = enc->storage;
    uint32_t offs = enc->offs;
    if (offs + 8 > storage) {
      storage = 2 * storage + 8;
      out = (unsigned char *)realloc(out, sizeof(*out) * storage);
      if (out == NULL) {
        enc->error = -1;
        return;
      }
      enc->buf = out;
      enc->storage = storage;
    }
    // Need to add 1 byte here since enc->cnt always counts 1 byte less
    // (enc->cnt = -9) to ensure correct operation
    uint8_t num_bytes_ready = (s >> 3) + 1;

    // Update "c" to contain the number of non-ready bits in "low". Since "low"
    // has 64-bit capacity, we need to add the (64 - 40) cushion bits and take
    // off the number of ready bits.
    c += 24 - (num_bytes_ready << 3);

    // Prepare "output" and update "low"
    uint64_t output = low >> c;
    low = low & (((uint64_t)1 << c) - 1);

    // Prepare data and carry mask
    uint64_t mask = (uint64_t)1 << (num_bytes_ready << 3);
    uint64_t carry = output & mask;

    mask = mask - 0x01;
    output = output & mask;

    // Write data in a single operation
    write_enc_data_to_out_buf(out, offs, output, carry, &enc->offs,
                              num_bytes_ready);

    // Update state of the encoder: enc->cnt to contain the number of residual
    // bits
    s = c + d - 24;
  }
  enc->low = low << d;
  enc->rng = rng << d;
  enc->cnt = s;
}